

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O3

void __thiscall
leveldb::log::LogTest::CheckOffsetPastEndReturnsNoRecords(LogTest *this,uint64_t offset_past_end)

{
  size_type sVar1;
  bool bVar2;
  Reader *this_00;
  pointer *__ptr;
  char *in_R9;
  string scratch;
  Slice record;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  internal local_90 [8];
  Reader *local_88;
  AssertHelper local_80;
  string local_78;
  string local_58;
  Slice local_38;
  
  WriteInitialOffsetLog(this);
  this->reading_ = true;
  sVar1 = (this->dest_).contents_._M_string_length;
  (this->source_).contents_.data_ = (this->dest_).contents_._M_dataplus._M_p;
  (this->source_).contents_.size_ = sVar1;
  this_00 = (Reader *)operator_new(0x58);
  Reader::Reader(this_00,&(this->source_).super_SequentialFile,&(this->report_).super_Reporter,true,
                 offset_past_end + sVar1);
  local_38.data_ = "";
  local_38.size_ = 0;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  bVar2 = Reader::ReadRecord(this_00,&local_38,&local_78);
  local_90[0] = (internal)!bVar2;
  local_88 = (Reader *)0x0;
  if ((bool)local_90[0]) {
    Reader::~Reader(this_00);
  }
  else {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,local_90,(AssertionResult *)"!offset_reader->ReadRecord(&record, &scratch)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/log_test.cc"
               ,0x85,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if (local_98._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_98._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
    this_00 = local_88;
    if (local_88 == (Reader *)0x0) goto LAB_00111c7c;
    if (local_88->file_ != (SequentialFile *)&local_88->checksum_) {
      operator_delete(local_88->file_);
    }
  }
  operator_delete(this_00);
LAB_00111c7c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CheckOffsetPastEndReturnsNoRecords(uint64_t offset_past_end) {
    WriteInitialOffsetLog();
    reading_ = true;
    source_.contents_ = Slice(dest_.contents_);
    Reader* offset_reader = new Reader(&source_, &report_, true /*checksum*/,
                                       WrittenBytes() + offset_past_end);
    Slice record;
    std::string scratch;
    ASSERT_TRUE(!offset_reader->ReadRecord(&record, &scratch));
    delete offset_reader;
  }